

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O1

unique_ptr<verilogAST::File,_std::default_delete<verilogAST::File>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::File,_std::default_delete<verilogAST::File>_> *node)

{
  undefined8 *puVar1;
  long lVar2;
  _Head_base<0UL,_verilogAST::File_*,_false> _Var3;
  long *in_RDX;
  undefined8 *puVar4;
  vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  new_modules;
  long *local_80;
  vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  local_78;
  long *local_58;
  _Head_base<0UL,_verilogAST::File_*,_false> local_50;
  vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar4 = *(undefined8 **)(*in_RDX + 8);
  puVar1 = *(undefined8 **)(*in_RDX + 0x10);
  local_58 = in_RDX;
  local_50._M_head_impl = (File *)this;
  if (puVar4 != puVar1) {
    do {
      local_80 = (long *)*puVar4;
      *puVar4 = 0;
      (**(code **)&(node->_M_t).
                   super___uniq_ptr_impl<verilogAST::File,_std::default_delete<verilogAST::File>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_verilogAST::File_*,_std::default_delete<verilogAST::File>_>
                   .super__Head_base<0UL,_verilogAST::File_*,_false>._M_head_impl[10].modules.
                   super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
                   ._M_impl)(&local_78,node,&local_80);
      std::
      vector<std::unique_ptr<verilogAST::AbstractModule,std::default_delete<verilogAST::AbstractModule>>,std::allocator<std::unique_ptr<verilogAST::AbstractModule,std::default_delete<verilogAST::AbstractModule>>>>
      ::
      emplace_back<std::unique_ptr<verilogAST::AbstractModule,std::default_delete<verilogAST::AbstractModule>>>
                ((vector<std::unique_ptr<verilogAST::AbstractModule,std::default_delete<verilogAST::AbstractModule>>,std::allocator<std::unique_ptr<verilogAST::AbstractModule,std::default_delete<verilogAST::AbstractModule>>>>
                  *)&local_48,
                 (unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>
                  *)&local_78);
      if (local_78.
          super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(((local_78.
                       super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                     super___uniq_ptr_impl<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_verilogAST::AbstractModule_*,_std::default_delete<verilogAST::AbstractModule>_>
                     .super__Head_base<0UL,_verilogAST::AbstractModule_*,_false>._M_head_impl + 0x10
                    ))();
      }
      local_78.
      super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      if (local_80 != (long *)0x0) {
        (**(code **)(*local_80 + 0x10))();
      }
      local_80 = (long *)0x0;
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar1);
  }
  lVar2 = *local_58;
  local_78.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(lVar2 + 8);
  local_78.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(lVar2 + 0x10);
  local_78.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar2 + 0x18);
  *(pointer *)(lVar2 + 8) =
       local_48.
       super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)(lVar2 + 0x10) =
       local_48.
       super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)(lVar2 + 0x18) =
       local_48.
       super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ::~vector(&local_78);
  _Var3._M_head_impl = local_50._M_head_impl;
  ((local_50._M_head_impl)->super_Node)._vptr_Node = (_func_int **)*local_58;
  *local_58 = 0;
  std::
  vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ::~vector(&local_48);
  return (__uniq_ptr_data<verilogAST::File,_std::default_delete<verilogAST::File>,_true,_true>)
         (__uniq_ptr_data<verilogAST::File,_std::default_delete<verilogAST::File>,_true,_true>)
         _Var3._M_head_impl;
}

Assistant:

std::unique_ptr<File> Transformer::visit(std::unique_ptr<File> node) {
  std::vector<std::unique_ptr<AbstractModule>> new_modules;
  for (auto&& item : node->modules) {
    new_modules.push_back(this->visit(std::move(item)));
  }
  node->modules = std::move(new_modules);
  return node;
}